

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O3

DisasJumpType op_vma(DisasContext_conflict13 *s,DisasOps *o)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  
  uVar2 = (s->fields).presentO;
  if ((uVar2 & 0x40) != 0) {
    bVar1 = (byte)(s->fields).c[4];
    if (2 < bVar1) {
      gen_program_exception(s,6);
      return DISAS_NORETURN;
    }
    bVar6 = (s->fields).field_0x9 + 0x57;
    if (6 < bVar6) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate_vx.inc.c"
                 ,0x6dc,(char *)0x0);
    }
    if ((uVar2 >> 0x16 & 1) != 0) {
      uVar3 = (s->fields).c[0];
      if ((uVar3 & 0xe0) == 0) {
        if ((uVar2 >> 0x17 & 1) == 0) goto LAB_00ccd99b;
        uVar4 = (s->fields).c[6];
        if ((uVar4 & 0xe0) == 0) {
          if ((uVar2 >> 0x18 & 1) == 0) goto LAB_00ccd99b;
          uVar5 = (s->fields).c[2];
          if ((uVar5 & 0xe0) == 0) {
            if ((uVar2 >> 0x19 & 1) == 0) goto LAB_00ccd99b;
            uVar2 = (s->fields).c[3];
            if ((uVar2 & 0xe0) == 0) {
              tcg_gen_gvec_4_s390x
                        (s->uc->tcg_ctx,(uVar3 & 0x1f) * 0x10 + 0x80,(uVar4 & 0x1f) * 0x10 + 0x80,
                         (uVar5 & 0x1f) * 0x10 + 0x80,(uVar2 & 0x1f) * 0x10 + 0x80,0x10,0x10,
                         (GVecGen4_conflict12 *)
                         (&DAT_00dc11d4 +
                         (long)*(int *)(&DAT_00dc11d4 + (ulong)bVar6 * 4) +
                         (ulong)((uint)bVar1 * 0x30)));
              return DISAS_NEXT;
            }
          }
        }
      }
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                 ,0xdf,"reg < 32");
    }
  }
LAB_00ccd99b:
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_vma(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t es = get_field(s, m5);
    static const GVecGen4 g_vmal[3] = {
        { .fno = gen_helper_gvec_vmal8, },
        { .fno = gen_helper_gvec_vmal16, },
        { .fni4 = gen_mal_i32, },
    };
    static const GVecGen4 g_vmah[3] = {
        { .fno = gen_helper_gvec_vmah8, },
        { .fno = gen_helper_gvec_vmah16, },
        { .fni4 = gen_mah_i32, },
    };
    static const GVecGen4 g_vmalh[3] = {
        { .fno = gen_helper_gvec_vmalh8, },
        { .fno = gen_helper_gvec_vmalh16, },
        { .fni4 = gen_malh_i32, },
    };
    static const GVecGen4 g_vmae[3] = {
        { .fno = gen_helper_gvec_vmae8, },
        { .fno = gen_helper_gvec_vmae16, },
        { .fno = gen_helper_gvec_vmae32, },
    };
    static const GVecGen4 g_vmale[3] = {
        { .fno = gen_helper_gvec_vmale8, },
        { .fno = gen_helper_gvec_vmale16, },
        { .fno = gen_helper_gvec_vmale32, },
    };
    static const GVecGen4 g_vmao[3] = {
        { .fno = gen_helper_gvec_vmao8, },
        { .fno = gen_helper_gvec_vmao16, },
        { .fno = gen_helper_gvec_vmao32, },
    };
    static const GVecGen4 g_vmalo[3] = {
        { .fno = gen_helper_gvec_vmalo8, },
        { .fno = gen_helper_gvec_vmalo16, },
        { .fno = gen_helper_gvec_vmalo32, },
    };
    const GVecGen4 *fn;

    if (es > ES_32) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    switch (s->fields.op2) {
    case 0xaa:
        fn = &g_vmal[es];
        break;
    case 0xab:
        fn = &g_vmah[es];
        break;
    case 0xa9:
        fn = &g_vmalh[es];
        break;
    case 0xae:
        fn = &g_vmae[es];
        break;
    case 0xac:
        fn = &g_vmale[es];
        break;
    case 0xaf:
        fn = &g_vmao[es];
        break;
    case 0xad:
        fn = &g_vmalo[es];
        break;
    default:
        g_assert_not_reached();
    }

    gen_gvec_4(tcg_ctx, get_field(s, v1), get_field(s, v2),
               get_field(s, v3), get_field(s, v4), fn);
    return DISAS_NEXT;
}